

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS
ref_interp_exhaustive_tri_around_node
          (REF_INTERP ref_interp,REF_INT node,REF_DBL *xyz,REF_INT *cell,REF_DBL *bary)

{
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_ADJ_ITEM pRVar1;
  uint uVar2;
  REF_INT cell_00;
  REF_STATUS ref_private_macro_code_rxs;
  int iVar3;
  ulong uVar4;
  uint unaff_R15D;
  double dVar5;
  REF_DBL current_bary [4];
  REF_INT nodes [27];
  int local_f4;
  double local_e8;
  double local_c8;
  double local_c0;
  double local_b8;
  undefined8 local_b0;
  REF_INT local_a8 [30];
  
  ref_cell = ref_interp->from_tri;
  cell_00 = -1;
  uVar4 = 0xffffffff;
  if (-1 < node) {
    uVar4 = 0xffffffff;
    if (node < ref_cell->ref_adj->nnode) {
      uVar4 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node];
    }
  }
  iVar3 = (int)uVar4;
  if (iVar3 != -1) {
    cell_00 = ref_cell->ref_adj->item[iVar3].ref;
  }
  ref_node = ref_interp->from_grid->node;
  if (iVar3 == -1) {
    local_f4 = -1;
  }
  else {
    local_e8 = -999.0;
    local_f4 = -1;
    do {
      uVar2 = ref_cell_nodes(ref_cell,cell_00,local_a8);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x5c,"ref_interp_exhaustive_tri_around_node",(ulong)uVar2,"cell");
        return uVar2;
      }
      uVar2 = ref_node_bary3(ref_node,local_a8,xyz,&local_c8);
      local_b0 = 0;
      if ((uVar2 & 0xfffffffb) != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x5f,"ref_interp_exhaustive_tri_around_node",(ulong)uVar2,"bary");
        unaff_R15D = uVar2;
      }
      if (uVar2 != 4) {
        if (uVar2 != 0) {
          return unaff_R15D;
        }
        dVar5 = local_c8;
        if (local_c0 <= local_c8) {
          dVar5 = local_c0;
        }
        if (local_b8 <= dVar5) {
          dVar5 = local_b8;
        }
        if ((local_f4 == -1) || (local_e8 < dVar5)) {
          local_f4 = cell_00;
          local_e8 = dVar5;
        }
      }
      pRVar1 = ref_cell->ref_adj->item;
      iVar3 = pRVar1[(int)uVar4].next;
      uVar4 = (ulong)iVar3;
      if (uVar4 == 0xffffffffffffffff) {
        cell_00 = -1;
      }
      else {
        cell_00 = pRVar1[uVar4].ref;
      }
    } while (iVar3 != -1);
  }
  if (local_f4 == -1) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x69,
           "ref_interp_exhaustive_tri_around_node","failed to find cell");
    uVar2 = 1;
  }
  else {
    *cell = local_f4;
    uVar2 = ref_cell_nodes(ref_cell,local_f4,local_a8);
    if (uVar2 == 0) {
      uVar2 = ref_node_bary3(ref_node,local_a8,xyz,bary);
      if (uVar2 == 0) {
        bary[3] = 0.0;
        uVar2 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x6d,"ref_interp_exhaustive_tri_around_node",(ulong)uVar2,"bary");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x6c
             ,"ref_interp_exhaustive_tri_around_node",(ulong)uVar2,"cell");
    }
  }
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_exhaustive_tri_around_node(
    REF_INTERP ref_interp, REF_INT node, REF_DBL *xyz, REF_INT *cell,
    REF_DBL *bary) {
  REF_CELL ref_cell = ref_interp_from_tri(ref_interp);
  REF_NODE ref_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, candidate, best_candidate;
  REF_DBL current_bary[4];
  REF_DBL best_bary, min_bary;
  REF_STATUS status;

  best_candidate = REF_EMPTY;
  best_bary = -999.0;
  each_ref_cell_having_node(ref_cell, node, item, candidate) {
    RSS(ref_cell_nodes(ref_cell, candidate, nodes), "cell");
    status = ref_node_bary3(ref_node, nodes, xyz, current_bary);
    current_bary[3] = 0.0;
    RXS(status, REF_DIV_ZERO, "bary");
    if (REF_SUCCESS == status) { /* exclude REF_DIV_ZERO */
      min_bary = MIN(MIN(current_bary[0], current_bary[1]), current_bary[2]);
      if (REF_EMPTY == best_candidate || min_bary > best_bary) {
        best_candidate = candidate;
        best_bary = min_bary;
      }
    }
  }

  RUS(REF_EMPTY, best_candidate, "failed to find cell");

  *cell = best_candidate;
  RSS(ref_cell_nodes(ref_cell, best_candidate, nodes), "cell");
  RSS(ref_node_bary3(ref_node, nodes, xyz, bary), "bary");
  bary[3] = 0.0;

  return REF_SUCCESS;
}